

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_CollapseIrredundant(Vec_Str_t *vSop,int nCubes,int nVars)

{
  char *pcVar1;
  long lVar2;
  lit *begin;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  void *pvVar7;
  ulong uVar8;
  sat_solver *s;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  size_t __size;
  long lVar15;
  ulong uVar16;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < nVars - 1U) {
    iVar9 = nVars;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  if (iVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar9 << 2);
  }
  p->pArray = piVar6;
  pcVar14 = vSop->pArray;
  piVar6 = (int *)malloc(0x10);
  iVar9 = 8;
  if (6 < nCubes - 1U) {
    iVar9 = nCubes;
  }
  piVar6[1] = 0;
  *piVar6 = iVar9;
  if (iVar9 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)iVar9 << 3);
  }
  *(void **)(piVar6 + 2) = pvVar7;
  uVar8 = (long)nVars + 3;
  if (vSop->nSize != nCubes * (int)uVar8 + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                  ,0xd5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
  }
  if (*pcVar14 == '\0') {
    uVar16 = 0;
  }
  else {
    __size = 0;
    iVar11 = 0;
    uVar16 = 0;
    do {
      if ((int)uVar16 == iVar9) {
        pvVar7 = *(void **)(piVar6 + 2);
        if (uVar16 < 0x10) {
          if (pvVar7 == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(pvVar7,0x80);
          }
          *(void **)(piVar6 + 2) = pvVar7;
          iVar9 = 0x10;
        }
        else {
          if (pvVar7 == (void *)0x0) {
            pvVar7 = malloc(__size);
          }
          else {
            pvVar7 = realloc(pvVar7,__size);
          }
          *(void **)(piVar6 + 2) = pvVar7;
          iVar9 = iVar11;
        }
      }
      else {
        pvVar7 = *(void **)(piVar6 + 2);
      }
      *(char **)((long)pvVar7 + uVar16 * 8) = pcVar14;
      uVar16 = uVar16 + 1;
      iVar11 = iVar11 + 2;
      __size = __size + 0x10;
      pcVar1 = pcVar14 + uVar8;
      pcVar14 = pcVar14 + uVar8;
    } while (*pcVar1 != '\0');
    piVar6[1] = (int)uVar16;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars);
  uVar3 = (uint)uVar16;
  uVar4 = uVar3 - 1;
  if (0 < (int)uVar3) {
    iVar9 = 0;
    uVar12 = (ulong)uVar4;
    uVar10 = uVar16;
    do {
      uVar13 = uVar12;
      if ((int)uVar3 < (int)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar2 = *(long *)(piVar6 + 2);
      pcVar14 = *(char **)(lVar2 + uVar13 * 8);
      p->nSize = 0;
      if (nVars < 1) {
        uVar4 = 0;
      }
      else {
        lVar15 = 0;
        do {
          if (*pcVar14 != '-') {
            Vec_IntPush(p,(uint)(*pcVar14 == '1') + (int)lVar15);
          }
          lVar15 = lVar15 + 2;
          pcVar14 = pcVar14 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar15);
        uVar4 = p->nSize;
      }
      begin = p->pArray;
      iVar11 = sat_solver_solve(s,begin,begin + (int)uVar4,0,0,0,0);
      if (iVar11 == -1) {
        *(undefined8 *)(lVar2 + uVar13 * 8) = 0;
        iVar9 = iVar9 + 1;
      }
      else {
        if (iVar11 != 1) {
          if (iVar11 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                          ,0xef,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
          }
          uVar4 = (uint)uVar13;
          goto LAB_0052f3cd;
        }
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            if (begin[uVar10] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf4,"int Abc_LitNot(int)");
            }
            begin[uVar10] = begin[uVar10] ^ 1;
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        iVar11 = sat_solver_addclause(s,begin,begin + (int)uVar4);
        if (iVar11 != 1) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                        ,0xf5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
        }
      }
      uVar12 = uVar13 - 1;
      uVar10 = uVar13;
    } while (0 < (long)uVar13);
    if (iVar9 < 1) {
      uVar4 = 0xffffffff;
      goto LAB_0052f3cd;
    }
    if ((int)uVar3 < 1) {
      uVar5 = 0;
      iVar9 = 1;
      uVar4 = 0;
    }
    else {
      uVar10 = 1;
      if (1 < (int)uVar8) {
        uVar10 = uVar8 & 0xffffffff;
      }
      lVar2 = *(long *)(piVar6 + 2);
      uVar12 = 0;
      uVar8 = 0;
      do {
        lVar15 = *(long *)(lVar2 + uVar12 * 8);
        if (lVar15 != 0 && -3 < nVars) {
          iVar9 = (int)uVar8;
          uVar13 = 0;
          do {
            if ((iVar9 < 0) || (vSop->nSize <= iVar9 + (int)uVar13)) goto LAB_0052f41b;
            vSop->pArray[uVar13 + uVar8] = *(char *)(lVar15 + uVar13);
            uVar13 = uVar13 + 1;
          } while (uVar10 != uVar13);
          uVar8 = (ulong)(uint)((int)uVar10 + iVar9);
        }
        uVar5 = (uint)uVar8;
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar16 & 0xffffffff));
      if ((int)uVar5 < 0) goto LAB_0052f41b;
      iVar9 = uVar5 + 1;
      uVar4 = uVar3;
    }
    if (vSop->nSize <= (int)uVar5) {
LAB_0052f41b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
    vSop->pArray[uVar5] = '\0';
    if (vSop->nSize <= (int)uVar5) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
    }
    vSop->nSize = iVar9;
  }
LAB_0052f3cd:
  sat_solver_delete(s);
  if (*(void **)(piVar6 + 2) != (void *)0x0) {
    free(*(void **)(piVar6 + 2));
  }
  free(piVar6);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return (int)(uVar4 == 0xffffffff);
}

Assistant:

int Bmc_CollapseIrredundant( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, iLit, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    // iterate through cubes in the reverse order
    Vec_PtrForEachEntryReverse( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        // if it does, then it should be added
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
        // make a clause out of the cube by complementing its literals
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == -1 && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}